

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O1

void __thiscall
jetbrains::teamcity::TeamcityMessages::suiteStarted
          (TeamcityMessages *this,string *name,string *flowId)

{
  pointer pcVar1;
  string *value;
  RaiiMessage msg;
  RaiiMessage local_60;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_60,"testSuiteStarted",this->m_out);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  anon_unknown_1::RaiiMessage::writeProperty(&local_60,"name",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (flowId->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + flowId->_M_string_length);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_60,(char *)local_58,value);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_60);
  return;
}

Assistant:

void TeamcityMessages::suiteStarted(const std::string& name, const std::string& flowId)
{
    RaiiMessage msg("testSuiteStarted", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}